

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

date_t duckdb::LastDayOperator::Operation<duckdb::date_t,duckdb::date_t>(date_t input)

{
  date_t dVar1;
  int32_t dd;
  int local_18;
  int32_t yyyy;
  
  Date::Convert(input,&yyyy,&local_18,&dd);
  yyyy = local_18 / 0xc + yyyy;
  local_18 = local_18 % 0xc + 1;
  dVar1 = Date::FromDate(yyyy,local_18,1);
  return (date_t)(dVar1.days + -1);
}

Assistant:

static inline TR Operation(TA input) {
		int32_t yyyy, mm, dd;
		Date::Convert(input, yyyy, mm, dd);
		yyyy += (mm / 12);
		mm %= 12;
		++mm;
		return Date::FromDate(yyyy, mm, 1) - 1;
	}